

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O0

int nni_plat_file_delete(char *name)

{
  int iVar1;
  int *piVar2;
  char *name_local;
  
  iVar1 = rmdir(name);
  if (iVar1 == 0) {
    name_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    if ((*piVar2 == 0x14) && (iVar1 = unlink(name), iVar1 == 0)) {
      return 0;
    }
    piVar2 = __errno_location();
    if (*piVar2 == 2) {
      name_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      name_local._4_4_ = nni_plat_errno(*piVar2);
    }
  }
  return name_local._4_4_;
}

Assistant:

int
nni_plat_file_delete(const char *name)
{
	if (rmdir(name) == 0) {
		return (0);
	}
	if ((errno == ENOTDIR) && (unlink(name) == 0)) {
		return (0);
	}
	if (errno == ENOENT) {
		return (0);
	}
	return (nni_plat_errno(errno));
}